

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::copyAppend
          (QGenericArrayOps<QSocks5RevivedDatagram> *this,QSocks5RevivedDatagram *b,
          QSocks5RevivedDatagram *e)

{
  qsizetype *pqVar1;
  QSocks5RevivedDatagram *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
    for (; b < e; b = b + 1) {
      QSocks5RevivedDatagram::QSocks5RevivedDatagram
                (pQVar2 + (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }